

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::ConditionalPropertyExprSyntax::setChild
          (ConditionalPropertyExprSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0048d150 + *(int *)(&DAT_0048d150 + index * 4)))();
  return;
}

Assistant:

void ConditionalPropertyExprSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: ifKeyword = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: condition = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: closeParen = child.token(); return;
        case 4: expr = child.node() ? &child.node()->as<PropertyExprSyntax>() : nullptr; return;
        case 5: elseClause = child.node() ? &child.node()->as<ElsePropertyClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}